

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator--(BigInt<unsigned_int,_unsigned_long> *this)

{
  bool bVar1;
  reference puVar2;
  iterator __first;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  const_iterator itEnd;
  iterator it;
  BigInt<unsigned_int,_unsigned_long> *this_local;
  
  if ((this->_positive & 1U) == 0) {
    this->_positive = true;
    operator++(this);
    this->_positive = false;
  }
  else {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->_values);
    if (bVar1) {
      it._M_current._4_4_ = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->_values,(value_type_conflict *)((long)&it._M_current + 4));
      this->_positive = false;
    }
    else {
      itEnd._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_values);
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(&this->_values);
      while (bVar1 = __gnu_cxx::
                     operator==<unsigned_int_*,_const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&itEnd,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
        puVar2 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&itEnd);
        if (*puVar2 != 0) {
          puVar2 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&itEnd);
          *puVar2 = *puVar2 - 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&itEnd);
      }
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_values);
      std::
      fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_long>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )itEnd._M_current,&_baseMax);
    }
  }
  return this;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator--()
	{
		if (!_positive)
		{
			_positive = true;
			++(*this);
			_positive = false;

			return *this;
		}

		if (_values.empty())
		{
			_values.push_back(1);
			_positive = false;
			return *this;
		}

		auto it = _values.begin();
		const auto itEnd = _values.cend();
		while (it != itEnd)
		{
			if (*it != 0)
			{
				--(*it);
				break;
			}
			++it;
		}

		std::fill(_values.begin(), it, _baseMax);

		return *this;
	}